

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterHyperCoDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxId SVar8;
  DataKey DVar9;
  long lVar10;
  ulong uVar11;
  int i;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)(this->bestPricesCo).super_IdxSet.num;
  if (lVar10 < 1) {
    i = -1;
    dVar14 = -1.0;
  }
  else {
    dVar12 = *best;
    piVar7 = (this->bestPricesCo).super_IdxSet.idx;
    uVar11 = lVar10 + 1;
    dVar14 = -1.0;
    i = -1;
    do {
      iVar2 = piVar7[uVar11 - 2];
      dVar1 = pdVar5[iVar2];
      if (-tol <= dVar1) {
        iVar3 = (this->bestPricesCo).super_IdxSet.num;
        (this->bestPricesCo).super_IdxSet.num = iVar3 + -1;
        piVar7[uVar11 - 2] = piVar7[(long)iVar3 + -1];
        (pSVar4->isInfeasibleCo).data[iVar2] = 0;
        dVar1 = dVar14;
      }
      else {
        dVar13 = pdVar6[iVar2];
        dVar15 = tol;
        if (tol <= dVar13) {
          dVar15 = dVar13;
        }
        dVar15 = (dVar1 * dVar1) / dVar15;
        if (dVar12 < dVar15) {
          *best = dVar15;
          dVar12 = dVar15;
          i = iVar2;
        }
        dVar1 = dVar15;
        if ((0.0 <= dVar14) && (dVar1 = dVar14, dVar15 < dVar14)) {
          dVar1 = dVar15;
        }
      }
      dVar14 = dVar1;
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  lVar10 = (long)(pSVar4->updateViolsCo).super_IdxSet.num;
  if (0 < lVar10) {
    uVar11 = lVar10 + 1;
    do {
      pSVar4 = (this->super_SPxPricer<double>).thesolver;
      piVar7 = (pSVar4->isInfeasibleCo).data;
      iVar2 = (pSVar4->updateViolsCo).super_IdxSet.idx[uVar11 - 2];
      if (piVar7[iVar2] == 1) {
        dVar12 = pdVar5[iVar2];
        if (-tol <= dVar12) {
          piVar7[iVar2] = 0;
        }
        else {
          dVar1 = pdVar6[iVar2];
          dVar13 = tol;
          if (tol <= dVar1) {
            dVar13 = dVar1;
          }
          dVar13 = (dVar12 * dVar12) / dVar13;
          if (dVar14 < dVar13) {
            if (*best <= dVar13 && dVar13 != *best) {
              *best = dVar13;
              i = iVar2;
            }
            piVar7[iVar2] = 2;
            DIdxSet::addIdx(&this->bestPricesCo,iVar2);
          }
        }
      }
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  if (i < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
    return (SPxId)DVar9;
  }
  SVar8 = SPxSolverBase<double>::id((this->super_SPxPricer<double>).thesolver,i);
  return (SPxId)SVar8.super_DataKey;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperCoDim(R& best, R tol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, weights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}